

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O0

bool __thiscall r_exec::HLPContext::operator==(HLPContext *this,HLPContext *c)

{
  byte bVar1;
  bool bVar2;
  Atom *this_00;
  Atom *pAVar3;
  HLPContext local_f8;
  HLPContext local_d8;
  HLPContext local_b8;
  HLPContext local_98;
  uint16_t local_74;
  ushort local_72;
  undefined4 local_70;
  uint16_t i;
  uint16_t atom_count;
  undefined1 local_60 [8];
  HLPContext rhs;
  HLPContext lhs;
  HLPContext *c_local;
  HLPContext *this_local;
  
  operator*((HLPContext *)&rhs.super__Context.index,this);
  operator*((HLPContext *)local_60,c);
  this_00 = operator[]((HLPContext *)&rhs.super__Context.index,0);
  pAVar3 = operator[]((HLPContext *)local_60,0);
  bVar1 = r_code::Atom::operator!=(this_00,pAVar3);
  if ((bVar1 & 1) == 0) {
    operator[]((HLPContext *)&rhs.super__Context.index,0);
    bVar1 = r_code::Atom::isStructural();
    if ((bVar1 & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      local_72 = getChildrenCount((HLPContext *)&rhs.super__Context.index);
      for (local_74 = 1; local_74 <= local_72; local_74 = local_74 + 1) {
        getChild(&local_b8,(HLPContext *)&rhs.super__Context.index,local_74);
        operator*(&local_98,&local_b8);
        getChild(&local_f8,(HLPContext *)local_60,local_74);
        operator*(&local_d8,&local_f8);
        bVar2 = operator!=(&local_98,&local_d8);
        ~HLPContext(&local_d8);
        ~HLPContext(&local_f8);
        ~HLPContext(&local_98);
        ~HLPContext(&local_b8);
        if (bVar2) {
          this_local._7_1_ = false;
          goto LAB_00249a9a;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00249a9a:
  local_70 = 1;
  ~HLPContext((HLPContext *)local_60);
  ~HLPContext((HLPContext *)&rhs.super__Context.index);
  return this_local._7_1_;
}

Assistant:

bool HLPContext::operator ==(const HLPContext &c) const
{
    HLPContext lhs = **this;
    HLPContext rhs = *c;

    if (lhs[0] != rhs[0]) { // both contexts point to an atom which is not a pointer.
        return false;
    }

    if (lhs[0].isStructural()) { // both are structural.
        uint16_t atom_count = lhs.getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i)
            if (*lhs.getChild(i) != *rhs.getChild(i)) {
                return false;
            }

        return true;
    }

    return true;
}